

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O3

void __thiscall SmallVector_DefaultCtor_Test::TestBody(SmallVector_DefaultCtor_Test *this)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer *__ptr;
  char *pcVar2;
  char *in_R9;
  small_vector<int,_8UL> b;
  AssertHelper local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  AssertHelper local_60;
  long local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  void *pvStack_30;
  undefined8 local_28;
  long lStack_20;
  undefined8 *local_18;
  
  local_18 = &uStack_50;
  local_28 = 0;
  lStack_20 = 0;
  local_38 = 0;
  pvStack_30 = (void *)0x0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_98.data_._0_4_ = 0;
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_80,"0U","b.size ()",(uint *)&local_98,(unsigned_long *)&local_90);
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90._M_head_impl + 0x10),
               "expected the initial size to be number number of stack elements",0x3f);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  local_98.data_._0_4_ = 8;
  pbVar1 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (lStack_20 - (long)pvStack_30 >> 2);
  local_90._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8 < pbVar1) {
    local_90._M_head_impl = pbVar1;
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_80,"8U","b.capacity ()",(uint *)&local_98,(unsigned_long *)&local_90)
  ;
  if (local_80[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_90);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  local_90._M_head_impl._0_1_ = local_58 == 0;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_58 != 0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)&local_90,(AssertionResult *)"b.empty ()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x1b,(char *)CONCAT71(local_80._1_7_,local_80[0]));
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_80._1_7_,local_80[0]) != &local_70) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_80._1_7_,local_80[0]),local_70._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) + 8))();
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
  }
  if (pvStack_30 != (void *)0x0) {
    operator_delete(pvStack_30,lStack_20 - (long)pvStack_30);
  }
  return;
}

Assistant:

TEST (SmallVector, MoveSmall) {
    pstore::small_vector<int, 4> a (std::size_t{3});
    pstore::small_vector<int, 4> b (std::size_t{4});
    std::fill (std::begin (a), std::end (a), 0);
    std::fill (std::begin (b), std::end (b), 73);

    a = std::move (b);
    EXPECT_THAT (a, ::testing::ElementsAre (73, 73, 73, 73));
}